

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeRunJustOnce(Parse *pParse,Expr *pExpr,int regDest)

{
  int *piVar1;
  int iVar2;
  Expr *pEVar3;
  ExprList *pEVar4;
  int in_EDX;
  long *in_RDI;
  ExprList_item *pItem_1;
  int addr;
  Vdbe *v;
  int i;
  ExprList_item *pItem;
  ExprList *p;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  sqlite3 *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  sqlite3 *in_stack_ffffffffffffffc0;
  Parse *pParse_00;
  int local_34;
  int *local_30;
  int local_1c;
  
  piVar1 = (int *)in_RDI[0xb];
  if ((in_EDX < 0) && (piVar1 != (int *)0x0)) {
    local_30 = piVar1 + 2;
    for (local_34 = *piVar1; 0 < local_34; local_34 = local_34 + -1) {
      if (((*(ushort *)((long)local_30 + 0x11) >> 3 & 1) != 0) &&
         (iVar2 = sqlite3ExprCompare((Parse *)CONCAT44(in_stack_ffffffffffffffbc,
                                                       in_stack_ffffffffffffffb8),
                                     (Expr *)in_stack_ffffffffffffffb0,
                                     (Expr *)CONCAT44(in_stack_ffffffffffffffac,
                                                      in_stack_ffffffffffffffa8),0), iVar2 == 0)) {
        return local_30[5];
      }
      local_30 = local_30 + 6;
    }
  }
  pEVar3 = sqlite3ExprDup(in_stack_ffffffffffffffc0,
                          (Expr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  local_1c = in_EDX;
  if ((pEVar3 == (Expr *)0x0) || ((pEVar3->flags & 8) == 0)) {
    pEVar4 = sqlite3ExprListAppend
                       ((Parse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (ExprList *)in_stack_ffffffffffffffb0,
                        (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pEVar4 != (ExprList *)0x0) {
      iVar2 = pEVar4->nExpr + -1;
      *(ushort *)&pEVar4->a[iVar2].fg.field_0x1 =
           *(ushort *)&pEVar4->a[iVar2].fg.field_0x1 & 0xfff7 | (ushort)(in_EDX < 0) << 3;
      if (in_EDX < 0) {
        local_1c = *(int *)((long)in_RDI + 0x3c) + 1;
        *(int *)((long)in_RDI + 0x3c) = local_1c;
      }
      pEVar4->a[iVar2].u.iConstExprReg = local_1c;
    }
    in_RDI[0xb] = (long)pEVar4;
  }
  else {
    pParse_00 = (Parse *)in_RDI[2];
    iVar2 = sqlite3VdbeAddOp0((Vdbe *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *(undefined1 *)((long)in_RDI + 0x23) = 0;
    if (*(char *)(*in_RDI + 0x67) == '\0') {
      if (in_EDX < 0) {
        local_1c = *(int *)((long)in_RDI + 0x3c) + 1;
        *(int *)((long)in_RDI + 0x3c) = local_1c;
      }
      sqlite3ExprCode(pParse_00,(Expr *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),
                      (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
    *(undefined1 *)((long)in_RDI + 0x23) = 1;
    sqlite3ExprDelete(in_stack_ffffffffffffffb0,
                      (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeRunJustOnce(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  assert( regDest!=0 );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->fg.reusable
       && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0
      ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  if( pExpr!=0 && ExprHasProperty(pExpr, EP_HasFunc) ){
    Vdbe *v = pParse->pVdbe;
    int addr;
    assert( v );
    addr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    pParse->okConstFactor = 0;
    if( !pParse->db->mallocFailed ){
      if( regDest<0 ) regDest = ++pParse->nMem;
      sqlite3ExprCode(pParse, pExpr, regDest);
    }
    pParse->okConstFactor = 1;
    sqlite3ExprDelete(pParse->db, pExpr);
    sqlite3VdbeJumpHere(v, addr);
  }else{
    p = sqlite3ExprListAppend(pParse, p, pExpr);
    if( p ){
       struct ExprList_item *pItem = &p->a[p->nExpr-1];
       pItem->fg.reusable = regDest<0;
       if( regDest<0 ) regDest = ++pParse->nMem;
       pItem->u.iConstExprReg = regDest;
    }
    pParse->pConstExpr = p;
  }
  return regDest;
}